

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiSetCond cond)

{
  ImGuiWindow *pIVar1;
  
  pIVar1 = FindWindowByName(name);
  if ((pIVar1 != (ImGuiWindow *)0x0) &&
     ((cond == 0 || ((pIVar1->SetWindowCollapsedAllowFlags & cond) != 0)))) {
    *(byte *)&pIVar1->SetWindowCollapsedAllowFlags =
         (byte)pIVar1->SetWindowCollapsedAllowFlags & 0xf1;
    pIVar1->Collapsed = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiSetCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowCollapsed(window, collapsed, cond);
}